

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O3

void __thiscall
vkt::tessellation::anon_unknown_2::PassthroughTestInstance::Params::Params(Params *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  
  this->useTessLevels = false;
  (this->vertices).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertices).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertices).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tessLevels).inner[0] = 0.0;
  (this->tessLevels).inner[1] = 0.0;
  (this->tessLevels).outer[0] = 0.0;
  (this->tessLevels).outer[1] = 0.0;
  (this->tessLevels).outer[2] = 0.0;
  (this->tessLevels).outer[3] = 0.0;
  this->primitiveType = TESSPRIMITIVETYPE_TRIANGLES;
  this->inputPatchVertices = 0;
  paVar1 = &this->pipelineCases[0].tessEvalShaderName.field_2;
  lVar2 = 0xd0;
  do {
    *(undefined2 *)((long)paVar1 + -0x18) = 0;
    (((string *)(paVar1 + -1))->_M_dataplus)._M_p = (pointer)paVar1;
    *(size_type *)((long)paVar1 + -8) = 0;
    paVar1->_M_local_buf[0] = '\0';
    paVar1[1]._M_allocated_capacity = (size_type)(paVar1 + 2);
    *(undefined8 *)((long)paVar1 + 0x18) = 0;
    paVar1[2]._M_local_buf[0] = 0;
    paVar1[3]._M_allocated_capacity = (size_type)(paVar1 + 4);
    *(undefined8 *)((long)paVar1 + 0x38) = 0;
    paVar1[4]._M_local_buf[0] = 0;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar1 + 0x68);
    lVar2 = lVar2 + -0x68;
  } while (lVar2 != 0);
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  (this->message)._M_string_length = 0;
  (this->message).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Params (void) : useTessLevels(), tessLevels(), primitiveType(), inputPatchVertices() {}